

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pnm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  ushort *puVar1;
  CImg<unsigned_char> *pCVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  CImgArgumentException *pCVar7;
  CImgIOException *this_00;
  unsigned_short *ptr;
  ulong uVar8;
  uchar *puVar9;
  byte *pbVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  char *pcVar19;
  char *pcVar20;
  size_t sVar21;
  FILE *pFVar22;
  uchar *puVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  uint H;
  uint W;
  CImg<unsigned_char> raw;
  uint D;
  FILE *local_a0;
  CImg<unsigned_char> *local_98;
  int rval;
  uint colormax;
  undefined8 local_88;
  uint ppm_type;
  ulong local_78;
  FILE *local_70;
  uchar *local_68;
  int bval;
  int gval;
  CImg<char> item;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar19 = "non-";
    if (this->_is_shared != false) {
      pcVar19 = "";
    }
    CImgArgumentException::CImgArgumentException
              (pCVar7,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar19,"unsigned char");
    __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  local_70 = file;
  if (file == (FILE *)0x0) {
    file = (FILE *)cimg::fopen(filename,"rb");
  }
  D = 1;
  colormax = 0xff;
  raw._0_8_ = raw._0_8_ & 0xffffffffffffff00;
  CImg<char>::CImg(&item,0x4000,1,1,1,(char *)&raw);
  while ((iVar3 = __isoc99_fscanf(file,"%16383[^\n]",item._data), iVar3 != -1 &&
         (iVar3 == 0 || *item._data == '#'))) {
    fgetc((FILE *)file);
  }
  iVar3 = __isoc99_sscanf(item._data," P%u",&ppm_type);
  local_a0 = (FILE *)file;
  if (iVar3 != 1) {
    if (local_70 == (FILE *)0x0) {
      cimg::fclose((FILE *)file);
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar19 = "non-";
    if (this->_is_shared != false) {
      pcVar19 = "";
    }
    pcVar20 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar20 = filename;
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar19,"unsigned char",pcVar20);
LAB_001a752b:
    __cxa_throw(this_00,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  while ((iVar3 = __isoc99_fscanf(file," %16383[^\n]",item._data), iVar3 != -1 &&
         (iVar3 == 0 || *item._data == '#'))) {
    fgetc((FILE *)file);
  }
  iVar3 = __isoc99_sscanf(item._data," %u %u %u %u",&W,&H,&D);
  pFVar22 = local_a0;
  if (iVar3 < 2) {
    if (local_70 == (FILE *)0x0) {
      cimg::fclose(local_a0);
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar19 = "non-";
    if (this->_is_shared != false) {
      pcVar19 = "";
    }
    pcVar20 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar20 = filename;
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): WIDTH and HEIGHT fields undefined in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar19,"unsigned char",pcVar20);
    goto LAB_001a752b;
  }
  if ((ppm_type != 1) && (ppm_type != 4)) {
    if ((iVar3 == 2) ||
       (((iVar3 == 3 && (ppm_type < 10)) && ((0x3a0U >> (ppm_type & 0x1f) & 1) != 0)))) {
      while ((iVar3 = __isoc99_fscanf(pFVar22," %16383[^\n]",item._data), iVar3 != -1 &&
             (iVar3 == 0 || *item._data == '#'))) {
        fgetc(pFVar22);
      }
      iVar3 = __isoc99_sscanf(item._data,"%u",&colormax);
      if (iVar3 != 1) {
        pcVar19 = "non-";
        if (this->_is_shared != false) {
          pcVar19 = "";
        }
        pcVar20 = "(FILE*)";
        if (filename != (char *)0x0) {
          pcVar20 = filename;
        }
        cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): COLORMAX field is undefined in file \'%s\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar19,"unsigned char",pcVar20);
      }
    }
    else {
      colormax = D;
      D = 1;
    }
  }
  pFVar22 = local_a0;
  fgetc(local_a0);
  local_98 = this;
  switch(ppm_type) {
  case 1:
    assign(this,W,H,1,1);
    lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar16 != 0) {
      puVar23 = local_98->_data;
      lVar24 = 0;
      do {
        iVar3 = __isoc99_fscanf(local_a0,"%d",&rval);
        if (iVar3 < 1) break;
        puVar23[lVar24] = -(rval == 0);
        lVar24 = lVar24 + 1;
      } while (lVar16 - lVar24 != 0);
    }
    goto LAB_001a71ff;
  case 2:
    assign(this,W,H,1,1);
    lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (lVar16 != 0) {
      puVar23 = local_98->_data;
      lVar24 = 0;
      do {
        iVar3 = __isoc99_fscanf(local_a0,"%d",&rval);
        if (iVar3 < 1) break;
        puVar23[lVar24] = (uchar)rval;
        lVar24 = lVar24 + 1;
      } while (lVar16 - lVar24 != 0);
    }
    goto LAB_001a71ff;
  case 3:
    assign(this,W,H,1,3);
    if (0 < (int)this->_height) {
      puVar9 = local_98->_data;
      lVar16 = (ulong)local_98->_depth * (ulong)local_98->_width * (ulong)local_98->_height;
      puVar23 = puVar9 + lVar16 * 2;
      puVar15 = puVar9 + lVar16;
      iVar3 = 0;
      do {
        if (0 < (int)local_98->_width) {
          lVar16 = 0;
          do {
            iVar4 = __isoc99_fscanf(local_a0,"%d %d %d",&rval,&gval,&bval);
            if (iVar4 != 3) break;
            puVar9[lVar16] = (uchar)rval;
            puVar15[lVar16] = (uchar)gval;
            puVar23[lVar16] = (uchar)bval;
            lVar16 = lVar16 + 1;
          } while ((int)lVar16 < (int)local_98->_width);
          puVar23 = puVar23 + lVar16;
          puVar15 = puVar15 + lVar16;
          puVar9 = puVar9 + lVar16;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)local_98->_height);
    }
    goto LAB_001a71ff;
  case 4:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    uVar5 = D * H * (((W >> 3) + 1) - (uint)((W & 7) == 0));
    if (uVar5 != 0) {
      puVar9 = (uchar *)(ulong)uVar5;
      puVar23 = this->_data;
      uVar5 = 0;
      local_88 = local_88 & 0xffffffff00000000;
      uVar13 = 0;
      do {
        local_78 = CONCAT44(local_78._4_4_,uVar5);
        puVar15 = (uchar *)0x1800000;
        if ((long)puVar9 < 0x1800000) {
          puVar15 = puVar9;
        }
        assign(&raw,(uint)puVar15,1,1,1);
        puVar15 = raw._data;
        uVar5 = raw._width;
        uVar14 = raw._0_8_ & 0xffffffff;
        if ((pFVar22 == (FILE *)0x0) || (raw._data == (uchar *)0x0)) {
          pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          pcVar19 = "";
          if (1 < uVar5) {
            pcVar19 = "s";
          }
          CImgArgumentException::CImgArgumentException
                    (pCVar7,
                     "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                     uVar14,"unsigned char",pcVar19,pFVar22,puVar15);
          __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,CImgException::~CImgException);
        }
        if (uVar14 != 0) {
          lVar16 = 0;
          uVar11 = uVar14;
          local_68 = puVar9;
          do {
            sVar21 = 0x3f00000;
            if (uVar11 < 0x3f00000) {
              sVar21 = uVar11;
            }
            sVar6 = fread(puVar15 + lVar16,1,sVar21,local_a0);
            puVar9 = local_68;
            pFVar22 = local_a0;
            lVar16 = lVar16 + sVar6;
            uVar11 = uVar11 - sVar6;
          } while ((sVar21 == sVar6) && (uVar11 != 0));
          if (uVar11 != 0) {
            cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar16,uVar14
                      );
          }
        }
        uVar14 = raw._0_8_ & 0xffffffff;
        bVar26 = uVar14 != 0;
        uVar5 = (uint)local_78;
        if (bVar26) {
          bVar25 = false;
          bVar17 = 0;
          pbVar10 = raw._data;
          uVar11 = uVar14;
          puVar15 = puVar23;
          bVar18 = 0;
          do {
            puVar23 = puVar15 + 1;
            if (!bVar25) {
              uVar11 = uVar11 - 1;
              bVar18 = 0x80;
              if (bVar26) {
                bVar17 = *pbVar10;
                pbVar10 = pbVar10 + 1;
              }
            }
            *puVar15 = -((bVar17 & bVar18) == 0);
            uVar13 = uVar13 + 1;
            if (uVar13 == W) {
              uVar13 = 0;
              if ((int)local_88 + 1U == H) {
                uVar5 = uVar5 + 1;
                uVar13 = 0;
                uVar8 = (ulong)local_88._4_4_;
                local_88 = uVar8 << 0x20;
                bVar18 = 0;
                if (uVar5 == D) {
                  local_88 = uVar8 << 0x20;
                  break;
                }
              }
              else {
                local_88 = CONCAT44(local_88._4_4_,(int)local_88 + 1U);
                bVar18 = 0;
              }
            }
            bVar26 = uVar11 != 0;
            bVar25 = 1 < bVar18;
            puVar15 = puVar23;
            bVar18 = bVar18 >> 1;
          } while (bVar26 || bVar25);
        }
        puVar9 = puVar9 + -uVar14;
      } while (0 < (long)puVar9);
    }
    goto joined_r0x001a693b;
  case 5:
  case 7:
    if (colormax < 0x100) {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,D,1);
      uVar14 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (0 < (long)uVar14) {
        puVar23 = local_98->_data;
        do {
          uVar11 = 0x1800000;
          if ((long)uVar14 < 0x1800000) {
            uVar11 = uVar14;
          }
          assign(&raw,(uint)uVar11,1,1,1);
          puVar9 = raw._data;
          uVar5 = raw._width;
          uVar11 = raw._0_8_ & 0xffffffff;
          if ((pFVar22 == (FILE *)0x0) || (raw._data == (uchar *)0x0)) {
            pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
            pcVar19 = "";
            if (1 < uVar5) {
              pcVar19 = "s";
            }
            CImgArgumentException::CImgArgumentException
                      (pCVar7,
                       "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                       ,uVar11,"unsigned char",pcVar19,pFVar22,puVar9);
            __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,CImgException::~CImgException);
          }
          if (uVar11 != 0) {
            lVar16 = 0;
            local_88 = uVar14;
            local_78 = uVar11;
            do {
              sVar21 = 0x3f00000;
              if (uVar11 < 0x3f00000) {
                sVar21 = uVar11;
              }
              sVar6 = fread(puVar9 + lVar16,1,sVar21,local_a0);
              uVar14 = local_88;
              pFVar22 = local_a0;
              lVar16 = lVar16 + sVar6;
              uVar11 = uVar11 - sVar6;
            } while ((sVar21 == sVar6) && (uVar11 != 0));
            if (uVar11 != 0) {
              cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar16,
                         local_78);
            }
          }
          uVar11 = raw._0_8_ & 0xffffffff;
          if (uVar11 != 0) {
            uVar8 = 0;
            do {
              puVar23[uVar8] = raw._data[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar11 != uVar8);
            puVar23 = puVar23 + uVar8;
          }
          uVar14 = uVar14 - uVar11;
        } while (0 < (long)uVar14);
      }
    }
    else {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,D,1);
      lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width;
      if (0 < lVar16) {
        puVar23 = local_98->_data;
        do {
          lVar24 = 0xc00000;
          if (lVar16 < 0xc00000) {
            lVar24 = lVar16;
          }
          CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)lVar24,1,1,1);
          cimg::fread<unsigned_short>
                    ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)pFVar22);
          if ((raw._0_8_ & 0xffffffff) != 0) {
            puVar9 = raw._data + (raw._0_8_ & 0xffffffff) * 2;
            do {
              puVar1 = (ushort *)(puVar9 + -2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              puVar9 = puVar9 + -2;
            } while (raw._data < puVar9);
          }
          uVar14 = raw._0_8_ & 0xffffffff;
          if (uVar14 != 0) {
            uVar11 = 0;
            do {
              puVar23[uVar11] = raw._data[uVar11 * 2];
              uVar11 = uVar11 + 1;
            } while (uVar14 != uVar11);
            puVar23 = puVar23 + uVar11;
          }
          lVar16 = lVar16 - uVar14;
        } while (0 < lVar16);
      }
    }
joined_r0x001a693b:
    if ((raw._is_shared != false) || (raw._data == (uchar *)0x0)) goto LAB_001a71ff;
    goto LAB_001a71fa;
  case 6:
    if (colormax < 0x100) {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,1,3);
      lVar16 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
      uVar14 = (ulong)this->_spectrum * lVar16;
      if (0 < (long)uVar14) {
        puVar9 = local_98->_data;
        puVar23 = puVar9 + lVar16 * 2;
        puVar15 = puVar9 + lVar16;
        do {
          uVar11 = 0x1800000;
          if ((long)uVar14 < 0x1800000) {
            uVar11 = uVar14;
          }
          assign(&raw,(uint)uVar11,1,1,1);
          puVar12 = raw._data;
          uVar5 = raw._width;
          uVar11 = raw._0_8_ & 0xffffffff;
          if ((pFVar22 == (FILE *)0x0) || (raw._data == (uchar *)0x0)) {
            pCVar7 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
            pcVar19 = "";
            if (1 < uVar5) {
              pcVar19 = "s";
            }
            CImgArgumentException::CImgArgumentException
                      (pCVar7,
                       "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                       ,uVar11,"unsigned char",pcVar19,pFVar22,puVar12);
            __cxa_throw(pCVar7,&CImgArgumentException::typeinfo,CImgException::~CImgException);
          }
          if (uVar11 != 0) {
            lVar16 = 0;
            local_88 = uVar14;
            local_78 = uVar11;
            local_68 = puVar15;
            do {
              sVar21 = 0x3f00000;
              if (uVar11 < 0x3f00000) {
                sVar21 = uVar11;
              }
              sVar6 = fread(puVar12 + lVar16,1,sVar21,local_a0);
              puVar15 = local_68;
              uVar14 = local_88;
              pFVar22 = local_a0;
              lVar16 = lVar16 + sVar6;
              uVar11 = uVar11 - sVar6;
            } while ((sVar21 == sVar6) && (uVar11 != 0));
            if (uVar11 != 0) {
              cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar16,
                         local_78);
            }
          }
          if (2 < (raw._0_8_ & 0xffffffff)) {
            lVar16 = 0;
            do {
              *puVar9 = raw._data[lVar16];
              puVar9 = puVar9 + 1;
              *puVar15 = raw._data[lVar16 + 1];
              puVar15 = puVar15 + 1;
              *puVar23 = raw._data[lVar16 + 2];
              puVar23 = puVar23 + 1;
              lVar16 = lVar16 + 3;
            } while (((raw._0_8_ & 0xffffffff) / 3) * 3 != lVar16);
          }
          uVar14 = uVar14 - (raw._0_8_ & 0xffffffff);
        } while (0 < (long)uVar14);
      }
    }
    else {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,1,3);
      lVar16 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
      lVar24 = (ulong)this->_spectrum * lVar16;
      if (0 < lVar24) {
        puVar9 = local_98->_data;
        puVar23 = puVar9 + lVar16 * 2;
        puVar15 = puVar9 + lVar16;
        do {
          lVar16 = 0xc00000;
          if (lVar24 < 0xc00000) {
            lVar16 = lVar24;
          }
          CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)lVar16,1,1,1);
          cimg::fread<unsigned_short>
                    ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)local_a0);
          if ((raw._0_8_ & 0xffffffff) != 0) {
            puVar12 = raw._data + (raw._0_8_ & 0xffffffff) * 2;
            do {
              puVar1 = (ushort *)(puVar12 + -2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              puVar12 = puVar12 + -2;
            } while (raw._data < puVar12);
          }
          if (2 < (raw._0_8_ & 0xffffffff)) {
            lVar16 = 0;
            do {
              *puVar9 = raw._data[lVar16];
              puVar9 = puVar9 + 1;
              *puVar15 = raw._data[lVar16 + 2];
              puVar15 = puVar15 + 1;
              *puVar23 = raw._data[lVar16 + 4];
              puVar23 = puVar23 + 1;
              lVar16 = lVar16 + 6;
            } while ((ulong)((uint)((raw._0_8_ & 0xffffffff) * 0xaaaaaaab >> 0x20) & 0xfffffffe) * 3
                     != lVar16);
          }
          lVar24 = lVar24 - (raw._0_8_ & 0xffffffff);
        } while (0 < lVar24);
      }
    }
    break;
  case 8:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (0 < lVar16) {
      puVar23 = local_98->_data;
      do {
        lVar24 = 0x1800000;
        if (lVar16 < 0x1800000) {
          lVar24 = lVar16;
        }
        CImg<int>::assign((CImg<int> *)&raw,(uint)lVar24,1,1,1);
        cimg::fread<int>((int *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)pFVar22);
        uVar14 = raw._0_8_ & 0xffffffff;
        if (uVar14 != 0) {
          uVar11 = 0;
          do {
            puVar23[uVar11] = raw._data[uVar11 * 4];
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
          puVar23 = puVar23 + uVar11;
        }
        lVar16 = lVar16 - uVar14;
      } while (0 < lVar16);
    }
    break;
  case 9:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    lVar16 = (ulong)this->_spectrum * (ulong)this->_depth *
             (ulong)this->_height * (ulong)this->_width;
    if (0 < lVar16) {
      puVar23 = local_98->_data;
      do {
        lVar24 = 0x1800000;
        if (lVar16 < 0x1800000) {
          lVar24 = lVar16;
        }
        CImg<float>::assign((CImg<float> *)&raw,(uint)lVar24,1,1,1);
        cimg::fread<float>((float *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)pFVar22);
        uVar14 = raw._0_8_ & 0xffffffff;
        if (uVar14 != 0) {
          uVar11 = 0;
          do {
            puVar23[uVar11] = (uchar)(int)*(float *)(raw._data + uVar11 * 4);
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
          puVar23 = puVar23 + uVar11;
        }
        lVar16 = lVar16 - uVar14;
      } while (0 < lVar16);
    }
    break;
  default:
    if ((this->_is_shared == false) && (this->_data != (uchar *)0x0)) {
      operator_delete__(this->_data);
    }
    pCVar2 = local_98;
    local_98->_data = (uchar *)0x0;
    local_98->_width = 0;
    local_98->_height = 0;
    local_98->_depth = 0;
    local_98->_spectrum = 0;
    local_98->_is_shared = false;
    if (local_70 == (FILE *)0x0) {
      cimg::fclose(local_a0);
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar19 = "non-";
    if (pCVar2->_is_shared != false) {
      pcVar19 = "";
    }
    pcVar20 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar20 = filename;
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM type \'P%d\' found, but type is not supported."
               ,(ulong)pCVar2->_width,(ulong)pCVar2->_height,(ulong)pCVar2->_depth,
               (ulong)pCVar2->_spectrum,pCVar2->_data,pcVar19,"unsigned char",pcVar20,
               (ulong)ppm_type);
    goto LAB_001a752b;
  }
  if ((raw._is_shared == false) && (raw._data != (uchar *)0x0)) {
LAB_001a71fa:
    operator_delete__(raw._data);
  }
LAB_001a71ff:
  pCVar2 = local_98;
  if (local_70 == (FILE *)0x0) {
    if (local_a0 == (FILE *)0x0) {
      cimg::warn("cimg::fclose(): Specified file is (null).");
    }
    else if (((_stdin != local_a0) && (_stdout != local_a0)) &&
            (uVar5 = fclose(local_a0), uVar5 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar5);
    }
  }
  if ((item._is_shared == false) && (item._data != (char *)0x0)) {
    operator_delete__(item._data);
  }
  return pCVar2;
}

Assistant:

CImg<T>& _load_pnm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pnm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      unsigned int ppm_type, W, H, D = 1, colormax = 255;
      CImg<charT> item(16384,1,1,1,0);
      int err, rval, gval, bval;
      const longT cimg_iobuffer = (longT)24*1024*1024;
      while ((err=std::fscanf(nfile,"%16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if (cimg_sscanf(item," P%u",&ppm_type)!=1) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if ((err=cimg_sscanf(item," %u %u %u %u",&W,&H,&D,&colormax))<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): WIDTH and HEIGHT fields undefined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (ppm_type!=1 && ppm_type!=4) {
        if (err==2 || (err==3 && (ppm_type==5 || ppm_type==7 || ppm_type==8 || ppm_type==9))) {
          while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
          if (cimg_sscanf(item,"%u",&colormax)!=1)
            cimg::warn(_cimg_instance
                       "load_pnm(): COLORMAX field is undefined in file '%s'.",
                       cimg_instance,
                       filename?filename:"(FILE*)");
        } else { colormax = D; D = 1; }
      }
      std::fgetc(nfile);

      switch (ppm_type) {
      case 1 : { // 2D b&w Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)(rval?0:255); else break; }
      } break;
      case 2 : { // 2D grey Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)rval; else break; }
      } break;
      case 3 : { // 2D color Ascii
        assign(W,H,1,3);
        T *ptrd = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        cimg_forXY(*this,x,y) {
          if (std::fscanf(nfile,"%d %d %d",&rval,&gval,&bval)==3) {
            *(ptrd++) = (T)rval; *(ptr_g++) = (T)gval; *(ptr_b++) = (T)bval;
          } else break;
        }
      } break;
      case 4 : { // 2D b&w binary (support 3D PINK extension)
        CImg<ucharT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        unsigned int w = 0, h = 0, d = 0;
        for (longT to_read = (longT)((W/8 + (W%8?1:0))*H*D); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const unsigned char *ptrs = raw._data;
          unsigned char mask = 0, val = 0;
          for (ulongT off = (ulongT)raw._width; off || mask; mask>>=1) {
            if (!mask) { if (off--) val = *(ptrs++); mask = 128; }
            *(ptrd++) = (T)((val&mask)?0:255);
            if (++w==W) { w = 0; mask = 0; if (++h==H) { h = 0; if (++d==D) break; }}
          }
        }
      } break;
      case 5 : case 7 : { // 2D/3D grey binary (support 3D PINK extension)
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
	    if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        }
      } break;
      case 6 : { // 2D color binary
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
            if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        }
      } break;
      case 8 : { // 2D/3D grey binary with int32 integers (PINK extension)
        CImg<intT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const int *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      case 9 : { // 2D/3D grey binary with float values (PINK extension)
        CImg<floatT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const float *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      default :
        assign();
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM type 'P%d' found, but type is not supported.",
                              cimg_instance,
                              filename?filename:"(FILE*)",ppm_type);
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }